

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDtdPtr xmlNewDtd(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlDtdPtr cur;
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  
  if ((doc != (xmlDocPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
    return (xmlDtdPtr)0x0;
  }
  cur = (xmlDtdPtr)(*xmlMalloc)(0x80);
  if (cur == (xmlDtdPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  cur->_private = (void *)0x0;
  *(undefined8 *)&cur->type = 0;
  cur->SystemID = (xmlChar *)0x0;
  cur->pentities = (void *)0x0;
  cur->entities = (void *)0x0;
  cur->ExternalID = (xmlChar *)0x0;
  cur->elements = (void *)0x0;
  cur->attributes = (void *)0x0;
  cur->doc = (_xmlDoc *)0x0;
  cur->notations = (void *)0x0;
  cur->next = (_xmlNode *)0x0;
  cur->prev = (_xmlNode *)0x0;
  cur->last = (_xmlNode *)0x0;
  cur->parent = (_xmlDoc *)0x0;
  cur->name = (xmlChar *)0x0;
  cur->children = (_xmlNode *)0x0;
  cur->type = XML_DTD_NODE;
  if (name != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(name);
    cur->name = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0014b91b;
  }
  if (ExternalID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(ExternalID);
    cur->ExternalID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0014b91b;
  }
  if (SystemID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(SystemID);
    cur->SystemID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) {
LAB_0014b91b:
      xmlFreeDtd(cur);
      return (xmlDtdPtr)0x0;
    }
  }
  if (doc != (xmlDocPtr)0x0) {
    doc->extSubset = cur;
  }
  cur->doc = doc;
  if (xmlRegisterCallbacks != 0) {
    pp_Var2 = __xmlRegisterNodeDefaultValue();
    if (*pp_Var2 != (xmlRegisterNodeFunc)0x0) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)cur);
      return cur;
    }
    return cur;
  }
  return cur;
}

Assistant:

xmlDtdPtr
xmlNewDtd(xmlDocPtr doc, const xmlChar *name,
                    const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if ((doc != NULL) && (doc->extSubset != NULL)) {
	return(NULL);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0 , sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL) {
	cur->name = xmlStrdup(name);
        if (cur->name == NULL)
            goto error;
    }
    if (ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ExternalID);
        if (cur->ExternalID == NULL)
            goto error;
    }
    if (SystemID != NULL) {
	cur->SystemID = xmlStrdup(SystemID);
        if (cur->SystemID == NULL)
            goto error;
    }
    if (doc != NULL)
	doc->extSubset = cur;
    cur->doc = doc;

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeDtd(cur);
    return(NULL);
}